

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGCG_SolverRandom.cpp
# Opt level: O1

double __thiscall BGCG_SolverRandom::Solve(BGCG_SolverRandom *this)

{
  size_t sVar1;
  bool bVar2;
  JPPV_sharedPtr jpolBG;
  JPPV_sharedPtr temp;
  shared_ptr<JointPolicyDiscretePure> local_50;
  JointPolicyPureVector *local_40;
  shared_count local_38;
  
  if ((this->super_BGCG_Solver).super_BayesianGameIdenticalPayoffSolver._m_solution.
      _m_nrDesiredSolutions != 0) {
    sVar1 = 1;
    do {
      (*(this->super_BGCG_Solver).super_BayesianGameIdenticalPayoffSolver.
        _vptr_BayesianGameIdenticalPayoffSolver[7])(&local_50,this);
      boost::dynamic_pointer_cast<JointPolicyPureVector,JointPolicyDiscretePure>
                ((boost *)&local_40,&local_50);
      boost::detail::shared_count::~shared_count(&local_50.pn);
      boost::make_shared<JointPolicyPureVector,JointPolicyPureVector&>((boost *)&local_50,local_40);
      (*((local_50.px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
        _vptr_JointPolicy[0xe])();
      BGIPSolution::AddSolution
                (&(this->super_BGCG_Solver).super_BayesianGameIdenticalPayoffSolver._m_solution,
                 local_50.px,0.0);
      boost::detail::shared_count::~shared_count(&local_50.pn);
      boost::detail::shared_count::~shared_count(&local_38);
      bVar2 = (this->super_BGCG_Solver).super_BayesianGameIdenticalPayoffSolver._m_solution.
              _m_nrDesiredSolutions != sVar1;
      sVar1 = (ulong)((int)sVar1 + 1);
    } while (bVar2);
  }
  return 0.0;
}

Assistant:

double BGCG_SolverRandom::Solve()
{
    double value = 0.0;
    for(Index i=0;i!=GetNrDesiredSolutions();++i)
    {
        //translate found configuration to jpol
        JPPV_sharedPtr temp = boost::dynamic_pointer_cast<JointPolicyPureVector>( GetNewJpol() );
        JPPV_sharedPtr jpolBG=boost::make_shared<JointPolicyPureVector>(*temp);
//        delete temp;
        jpolBG->RandomInitialization();

        //store the solution
        AddSolution(*jpolBG,value);
    }

    return(value);
}